

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

XML_Convert_Result
utf8_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  XML_Convert_Result XVar5;
  ushort *puVar6;
  byte *pbVar7;
  bool bVar8;
  
  puVar6 = *toP;
  pbVar7 = (byte *)*fromP;
  bVar8 = pbVar7 < fromLim;
  if (puVar6 < toLim && bVar8) {
    do {
      bVar1 = *pbVar7;
      uVar3 = (ushort)bVar1;
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)uVar3);
      if (cVar2 == '\a') {
        if ((long)toLim - (long)puVar6 < 3) {
          XVar5 = XML_CONVERT_OUTPUT_EXHAUSTED;
          goto LAB_0045d8c7;
        }
        if ((long)fromLim - (long)pbVar7 < 4) goto LAB_0045d8bb;
        iVar4 = (pbVar7[2] & 0x3f) * 0x40;
        bVar1 = pbVar7[3];
        *puVar6 = (ushort)(((pbVar7[1] & 0x3f) << 0xc | (uVar3 & 7) << 0x12) + iVar4 + 0xff0000 >>
                          10) | 0xd800;
        puVar6[1] = bVar1 & 0x3f | (ushort)iVar4 | 0xdc00;
        puVar6 = puVar6 + 2;
        pbVar7 = pbVar7 + 4;
      }
      else if (cVar2 == '\x06') {
        if ((long)fromLim - (long)pbVar7 < 3) {
LAB_0045d8bb:
          XVar5 = XML_CONVERT_INPUT_INCOMPLETE;
          goto LAB_0045d8c7;
        }
        *puVar6 = pbVar7[2] & 0x3f | (pbVar7[1] & 0x3f) << 6 | uVar3 << 0xc;
        puVar6 = puVar6 + 1;
        pbVar7 = pbVar7 + 3;
      }
      else if (cVar2 == '\x05') {
        if ((long)fromLim - (long)pbVar7 < 2) goto LAB_0045d8bb;
        *puVar6 = pbVar7[1] & 0x3f | (uVar3 & 0x1f) << 6;
        puVar6 = puVar6 + 1;
        pbVar7 = pbVar7 + 2;
      }
      else {
        pbVar7 = pbVar7 + 1;
        *puVar6 = (short)(char)bVar1;
        puVar6 = puVar6 + 1;
      }
      bVar8 = pbVar7 < fromLim;
    } while ((bVar8) && (puVar6 < toLim));
  }
  XVar5 = (uint)bVar8 * 2;
LAB_0045d8c7:
  *fromP = (char *)pbVar7;
  *toP = puVar6;
  return XVar5;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf16(const ENCODING *enc,
             const char **fromP, const char *fromLim,
             unsigned short **toP, const unsigned short *toLim)
{
  enum XML_Convert_Result res = XML_CONVERT_COMPLETED;
  unsigned short *to = *toP;
  const char *from = *fromP;
  while (from < fromLim && to < toLim) {
    switch (((struct normal_encoding *)enc)->type[(unsigned char)*from]) {
    case BT_LEAD2:
      if (fromLim - from < 2) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0x1f) << 6) | (from[1] & 0x3f));
      from += 2;
      break;
    case BT_LEAD3:
      if (fromLim - from < 3) {
        res = XML_CONVERT_INPUT_INCOMPLETE;
        goto after;
      }
      *to++ = (unsigned short)(((from[0] & 0xf) << 12)
                               | ((from[1] & 0x3f) << 6) | (from[2] & 0x3f));
      from += 3;
      break;
    case BT_LEAD4:
      {
        unsigned long n;
        if (toLim - to < 2) {
          res = XML_CONVERT_OUTPUT_EXHAUSTED;
          goto after;
        }
        if (fromLim - from < 4) {
          res = XML_CONVERT_INPUT_INCOMPLETE;
          goto after;
        }
        n = ((from[0] & 0x7) << 18) | ((from[1] & 0x3f) << 12)
            | ((from[2] & 0x3f) << 6) | (from[3] & 0x3f);
        n -= 0x10000;
        to[0] = (unsigned short)((n >> 10) | 0xD800);
        to[1] = (unsigned short)((n & 0x3FF) | 0xDC00);
        to += 2;
        from += 4;
      }
      break;
    default:
      *to++ = *from++;
      break;
    }
  }
  if (from < fromLim)
    res = XML_CONVERT_OUTPUT_EXHAUSTED;
after:
  *fromP = from;
  *toP = to;
  return res;
}